

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O2

void * sx__malloc_leakd_cb(void *ptr,size_t size,uint32_t align,char *file,char *func,uint32_t line,
                          void *user_data)

{
  void *pvVar1;
  
  if (size == 0) {
    if (ptr != (void *)0x0) {
      if (align < 9) {
        stb_leakcheck_free(ptr);
      }
      else {
        sx__aligned_free(&g_alloc_malloc_leakd,ptr,file,func,line);
      }
    }
  }
  else {
    if (ptr == (void *)0x0) {
      if (align < 9) {
        pvVar1 = stb_leakcheck_malloc(size,file,func,line);
        return pvVar1;
      }
      pvVar1 = sx__aligned_alloc(&g_alloc_malloc_leakd,size,align,file,func,line);
      return pvVar1;
    }
    if (8 < align) {
      pvVar1 = sx__aligned_realloc(&g_alloc_malloc_leakd,ptr,size,align,file,func,line);
      return pvVar1;
    }
    if (size <= *(ulong *)((long)ptr + -0x18)) {
      return ptr;
    }
    pvVar1 = stb_leakcheck_malloc(size,file,func,line);
    if (pvVar1 != (void *)0x0) {
      memcpy(pvVar1,ptr,*(size_t *)((long)ptr + -0x18));
      stb_leakcheck_free(ptr);
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void* sx__malloc_leakd_cb(void* ptr, size_t size, uint32_t align, const char* file,
                                 const char* func, uint32_t line, void* user_data)
{
    sx_unused(user_data);
    if (size == 0) {
        if (ptr) {
            if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT) {
                stb_leakcheck_free(ptr);
                return NULL;
            }

            sx__aligned_free(&g_alloc_malloc_leakd, ptr, file, func, line);
        }
        return NULL;
    } else if (ptr == NULL) {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return stb_leakcheck_malloc(size, file, func, (int)line);

        return sx__aligned_alloc(&g_alloc_malloc_leakd, size, align, file, func, line);
    } else {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return stb_leakcheck_realloc(ptr, size, file, func, (int)line);

        return sx__aligned_realloc(&g_alloc_malloc_leakd, ptr, size, align, file, func, line);
    }
}